

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_311d49::Handlers::addParameter(Handlers *this,param_handler_t *fn)

{
  JSONHandler *this_00;
  function<void_(const_char_*)> local_58;
  string_handler_t local_38;
  param_handler_t *local_18;
  param_handler_t *fn_local;
  Handlers *this_local;
  
  this_00 = this->jh;
  local_18 = fn;
  fn_local = (param_handler_t *)this;
  std::function<void_(const_char_*)>::function(&local_58,fn);
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::addParameter(std::function<void(char_const*)>)::__0,void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_38,
             (anon_class_32_1_3fcf6586 *)&local_58);
  JSONHandler::addStringHandler(this_00,&local_38);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  (anonymous_namespace)::Handlers::addParameter(std::function<void(char_const*)>)::$_0::~__0
            ((__0 *)&local_58);
  return;
}

Assistant:

void
Handlers::addParameter(param_handler_t fn)
{
    jh->addStringHandler(
        [fn](std::string const& path, std::string const& parameter) { fn(parameter.c_str()); });
}